

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O1

ssize_t zip_entry_noallocread(zip_t *zip,void *buf,size_t bufsize)

{
  long lVar1;
  mz_bool mVar2;
  mz_uint64 mVar3;
  
  if (zip != (zip_t *)0x0) {
    mVar3 = 0xfffffffffffffffd;
    if (((zip->archive).m_zip_mode == MZ_ZIP_MODE_READING) &&
       (lVar1 = (zip->entry).index, -1 < lVar1)) {
      mVar2 = mz_zip_reader_extract_to_mem_no_alloc1
                        (&zip->archive,(mz_uint)lVar1,buf,bufsize,0,(void *)0x0,0,
                         (mz_zip_archive_file_stat *)0x0);
      if (mVar2 == 0) {
        mVar3 = 0xffffffffffffffee;
      }
      else {
        mVar3 = (zip->entry).uncomp_size;
      }
    }
    return mVar3;
  }
  return -1;
}

Assistant:

ssize_t zip_entry_noallocread(struct zip_t *zip, void *buf, size_t bufsize) {
  mz_zip_archive *pzip = NULL;

  if (!zip) {
    // zip_t handler is not initialized
    return (ssize_t)ZIP_ENOINIT;
  }

  pzip = &(zip->archive);
  if (pzip->m_zip_mode != MZ_ZIP_MODE_READING ||
      zip->entry.index < (ssize_t)0) {
    // the entry is not found or we do not have read access
    return (ssize_t)ZIP_ENOENT;
  }

  if (!mz_zip_reader_extract_to_mem_no_alloc(pzip, (mz_uint)zip->entry.index,
                                             buf, bufsize, 0, NULL, 0)) {
    return (ssize_t)ZIP_EMEMNOALLOC;
  }

  return (ssize_t)zip->entry.uncomp_size;
}